

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

int fio_clear_fd(intptr_t fd,uint8_t is_open)

{
  undefined1 *puVar1;
  undefined1 uVar2;
  char cVar3;
  undefined1 uVar4;
  long lVar5;
  long lVar6;
  long *__ptr;
  void *__ptr_00;
  void *arg2;
  long lVar7;
  undefined8 uVar8;
  code *pcVar9;
  fio_packet_s *pfVar10;
  fio_data_s *pfVar11;
  int extraout_EAX;
  int iVar12;
  int extraout_EAX_00;
  undefined8 *puVar13;
  char *pcVar14;
  long lVar15;
  fio_data_s *pfVar16;
  uint uVar17;
  ulong uVar18;
  fio_uuid_links__ordered_s_ *pos;
  long *plVar19;
  fio_packet_s *tmp;
  fio_packet_s *packet;
  fio_lock_i ret;
  
  lVar15 = fd * 0xa8;
  fio_lock((fio_lock_i *)((long)fio_data + lVar15 + 0x6e));
  pfVar11 = fio_data;
  puVar13 = (undefined8 *)((long)fio_data + lVar15 + 0x40);
  lVar5 = *(long *)((long)fio_data + lVar15 + 0xb8);
  lVar6 = *(long *)((long)fio_data + lVar15 + 200);
  __ptr = *(long **)((long)fio_data + lVar15 + 0xd0);
  __ptr_00 = *(void **)((long)fio_data + lVar15 + 0xd8);
  packet = (fio_packet_s *)*puVar13;
  arg2 = *(void **)((long)fio_data + lVar15 + 0x58);
  lVar7 = *(long *)((long)fio_data + lVar15 + 0xa8);
  uVar8 = *(undefined8 *)((long)fio_data + lVar15 + 0xb0);
  uVar2 = *(undefined1 *)((long)fio_data + lVar15 + 0x6c);
  cVar3 = *(char *)((long)fio_data + lVar15 + 0x6d);
  uVar4 = *(undefined1 *)((long)fio_data + lVar15 + 0x6e);
  *puVar13 = 0;
  *(undefined8 **)((long)pfVar11 + lVar15 + 0x48) = puVar13;
  *(undefined4 *)((long)pfVar11 + lVar15 + 0x68) = 0;
  *(undefined8 *)((long)pfVar11 + lVar15 + 0x60) = 0;
  *(undefined8 *)((long)pfVar11 + lVar15 + 0x50) = 0;
  *(undefined8 *)((long)pfVar11 + lVar15 + 0x58) = 0;
  *(undefined1 *)((long)pfVar11 + lVar15 + 0x6c) = uVar2;
  *(char *)((long)pfVar11 + lVar15 + 0x6d) = cVar3 + '\x01';
  *(undefined1 *)((long)pfVar11 + lVar15 + 0x6e) = uVar4;
  *(uint8_t *)((long)pfVar11 + lVar15 + 0x6f) = is_open;
  *(undefined8 *)((long)pfVar11 + lVar15 + 0xa0) = 0;
  *(undefined8 *)((long)pfVar11 + lVar15 + 0x90) = 0;
  *(undefined8 *)((long)pfVar11 + lVar15 + 0x98) = 0;
  *(undefined8 *)((long)pfVar11 + lVar15 + 0x80) = 0;
  *(undefined8 *)((long)pfVar11 + lVar15 + 0x88) = 0;
  *(undefined8 *)((long)pfVar11 + lVar15 + 0x70) = 0;
  *(undefined8 *)((long)pfVar11 + lVar15 + 0x78) = 0;
  *(fio_rw_hook_s **)((long)pfVar11 + lVar15 + 0xa8) = &FIO_DEFAULT_RW_HOOKS;
  pfVar16 = (fio_data_s *)0x0;
  *(undefined8 *)((long)pfVar11 + lVar15 + 0xe0) = 0;
  *(undefined4 *)((long)pfVar11 + lVar15 + 0xd0) = 0;
  *(undefined4 *)((long)pfVar11 + lVar15 + 0xd4) = 0;
  *(undefined4 *)((long)pfVar11 + lVar15 + 0xd8) = 0;
  *(undefined4 *)((long)pfVar11 + lVar15 + 0xdc) = 0;
  *(undefined4 *)((long)pfVar11 + lVar15 + 0xc0) = 0;
  *(undefined4 *)((long)pfVar11 + lVar15 + 0xc4) = 0;
  *(undefined4 *)((long)pfVar11 + lVar15 + 200) = 0;
  *(undefined4 *)((long)pfVar11 + lVar15 + 0xcc) = 0;
  *(undefined4 *)((long)pfVar11 + lVar15 + 0xb0) = 0;
  *(undefined4 *)((long)pfVar11 + lVar15 + 0xb4) = 0;
  *(undefined4 *)((long)pfVar11 + lVar15 + 0xb8) = 0;
  *(undefined4 *)((long)pfVar11 + lVar15 + 0xbc) = 0;
  uVar18 = (ulong)pfVar11->max_protocol_fd;
  if ((long)uVar18 < fd) {
    pfVar11->max_protocol_fd = (uint32_t)fd;
  }
  else {
    pfVar16 = pfVar11 + 1;
    while ((uVar17 = (int)uVar18 - 1, (int)uVar18 != 0 &&
           (*(char *)((long)pfVar11 + uVar18 * 0xa8 + 0x6f) == '\0'))) {
      pfVar11->max_protocol_fd = uVar17;
      uVar18 = (ulong)uVar17;
    }
  }
  LOCK();
  puVar1 = (undefined1 *)((long)pfVar11 + lVar15 + 0x6e);
  uVar2 = *puVar1;
  *puVar1 = 0;
  UNLOCK();
  if ((lVar7 != 0) && (pcVar9 = *(code **)(lVar7 + 0x20), pcVar9 != (code *)0x0)) {
    (*pcVar9)(uVar8,pfVar16,uVar2,CONCAT71((int7)((ulong)puVar13 >> 8),uVar2));
  }
  while (packet != (fio_packet_s *)0x0) {
    pfVar10 = packet->next;
    fio_packet_free(packet);
    packet = pfVar10;
  }
  if (lVar5 != 0) {
    for (plVar19 = __ptr; (plVar19 != (long *)0x0 && (plVar19 < __ptr + lVar6 * 2));
        plVar19 = plVar19 + 2) {
      if (*plVar19 != 0) {
        (*(code *)plVar19[1])();
      }
    }
  }
  free(__ptr_00);
  free(__ptr);
  iVar12 = extraout_EAX;
  if ((arg2 != (void *)0x0) && (*(long *)((long)arg2 + 0x18) != 0)) {
    iVar12 = fio_defer(deferred_on_close,
                       (void *)((ulong)*(byte *)((long)fio_data + lVar15 + 0x6d) | fd << 8),arg2);
  }
  if (4 < FIO_LOG_LEVEL) {
    pcVar14 = "open";
    if (is_open == '\0') {
      pcVar14 = "closed";
    }
    FIO_LOG2STDERR("DEBUG (/workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/facil/lib/facil/fio.c:333): FD %d re-initialized (state: %p-%s)."
                   ,fd & 0xffffffff,(ulong)*(byte *)((long)fio_data + lVar15 + 0x6d) | fd << 8,
                   pcVar14);
    return extraout_EAX_00;
  }
  return iVar12;
}

Assistant:

static inline int fio_clear_fd(intptr_t fd, uint8_t is_open) {
  fio_packet_s *packet;
  fio_protocol_s *protocol;
  fio_rw_hook_s *rw_hooks;
  void *rw_udata;
  fio_uuid_links_s links;
  fio_lock(&(fd_data(fd).sock_lock));
  links = fd_data(fd).links;
  packet = fd_data(fd).packet;
  protocol = fd_data(fd).protocol;
  rw_hooks = fd_data(fd).rw_hooks;
  rw_udata = fd_data(fd).rw_udata;
  fd_data(fd) = (fio_fd_data_s){
      .open = is_open,
      .sock_lock = fd_data(fd).sock_lock,
      .protocol_lock = fd_data(fd).protocol_lock,
      .rw_hooks = (fio_rw_hook_s *)&FIO_DEFAULT_RW_HOOKS,
      .counter = fd_data(fd).counter + 1,
      .packet_last = &fd_data(fd).packet,
  };
  if (fio_data->max_protocol_fd < fd) {
    fio_data->max_protocol_fd = fd;
  } else {
    while (fio_data->max_protocol_fd &&
           !fd_data(fio_data->max_protocol_fd).open)
      --fio_data->max_protocol_fd;
  }
  fio_unlock(&(fd_data(fd).sock_lock));
  if (rw_hooks && rw_hooks->cleanup)
    rw_hooks->cleanup(rw_udata);
  while (packet) {
    fio_packet_s *tmp = packet;
    packet = packet->next;
    fio_packet_free(tmp);
  }
  if (fio_uuid_links_count(&links)) {
    FIO_SET_FOR_LOOP(&links, pos) {
      if (pos->hash)
        pos->obj((void *)pos->hash);
    }
  }
  fio_uuid_links_free(&links);
  if (protocol && protocol->on_close) {
    fio_defer(deferred_on_close, (void *)fd2uuid(fd), protocol);
  }
  FIO_LOG_DEBUG("FD %d re-initialized (state: %p-%s).", (int)fd,
                (void *)fd2uuid(fd), (is_open ? "open" : "closed"));
  return 0;
}